

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

UBool isCanonSegmentStarter(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  UBool UVar1;
  Normalizer2Impl *this;
  bool local_29;
  Normalizer2Impl *impl;
  UProperty local_18;
  UErrorCode errorCode;
  UProperty param_2_local;
  UChar32 c_local;
  BinaryProperty *param_0_local;
  
  impl._4_4_ = U_ZERO_ERROR;
  local_18 = param_3;
  errorCode = c;
  _param_2_local = param_1;
  this = icu_63::Normalizer2Factory::getNFCImpl((UErrorCode *)((long)&impl + 4));
  UVar1 = U_SUCCESS(impl._4_4_);
  local_29 = false;
  if (UVar1 != '\0') {
    UVar1 = icu_63::Normalizer2Impl::ensureCanonIterData(this,(UErrorCode *)((long)&impl + 4));
    local_29 = false;
    if (UVar1 != '\0') {
      UVar1 = icu_63::Normalizer2Impl::isCanonSegmentStarter(this,errorCode);
      local_29 = UVar1 != '\0';
    }
  }
  return local_29;
}

Assistant:

static UBool isCanonSegmentStarter(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
    return
        U_SUCCESS(errorCode) && impl->ensureCanonIterData(errorCode) &&
        impl->isCanonSegmentStarter(c);
}